

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.h
# Opt level: O1

void __thiscall chrono::ChLoadXYZnodeXYZnode::~ChLoadXYZnodeXYZnode(ChLoadXYZnodeXYZnode *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

class ChApi ChLoadXYZnodeXYZnode : public ChLoadCustomMultiple {
  public:
    ChLoadXYZnodeXYZnode(std::shared_ptr<ChNodeXYZ> mnodeA,  ///< node A to apply load to
						 std::shared_ptr<ChNodeXYZ> mnodeB   ///< node B to apply load to, as reaction
    );

    /// Compute the force on the node A, in absolute coordsystem,
    /// given position and speed of node respect to the other. Node B gets the opposite.
    /// Inherited classes MUST IMPLEMENT THIS.
    virtual void ComputeForce(const ChVector<>& rel_pos,
							  const ChVector<>& rel_vel,
                              ChVector<>& abs_force) = 0;

	// Optional: inherited classes could implement this to avoid the
    // default numerical computation of jacobians:
    //   virtual void ComputeJacobian(...) // see ChLoad

    /// Compute Q, the generalized load.
    /// Called automatically at each Update().
    virtual void ComputeQ(ChState* state_x,      ///< state position to evaluate Q
                          ChStateDelta* state_w  ///< state speed to evaluate Q
                          ) override;

	/// For diagnosis purposes, this can return the actual last computed value of
    /// the applied force, expressed in absolute coordinate system, assumed applied to node
    ChVector<> GetForce() const { return computed_abs_force; }

  protected:

	/// Inherited classes could override this and return true, if the load benefits from a jacobian
	/// when using implicit integrators. 
    virtual bool IsStiff() override { return false; }

    virtual void Update(double time) override;

	ChVector<> computed_abs_force;
}